

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O3

array_t<unsigned_char,_16> __thiscall
CoreML::MilStoragePython::MilStoragePythonReader::read_uint3_data
          (MilStoragePythonReader *this,uint64_t offset)

{
  ulong uVar1;
  uchar *__first;
  uint64_t in_RDX;
  long lVar2;
  Span<const_MILBlob::UInt3,_18446744073709551615UL> SVar3;
  vector<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_> unpackedUIntSubByteData;
  allocator_type local_41;
  vector<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_> local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  SVar3 = MILBlob::Blob::StorageReader::GetDataView<MILBlob::UInt3>
                    (*(StorageReader **)offset,in_RDX);
  __first = (uchar *)SVar3.m_ptr;
  uVar1 = SVar3.m_size.m_size.m_size * 3;
  lVar2 = ((uVar1 >> 3) + 1) - (ulong)((uVar1 & 7) == 0);
  if (lVar2 == 0) {
    __first = (uchar *)0x0;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,__first,
             __first + lVar2,&local_41);
  MILBlob::UnPackSubByteVec<MILBlob::UInt3>(&local_40,&local_28,SVar3.m_size.m_size.m_size);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pybind11::array_t<unsigned_char,_16>::array_t
            ((array_t<unsigned_char,_16> *)this,
             (long)local_40.super__Vector_base<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_40.super__Vector_base<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             &(local_40.super__Vector_base<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_>._M_impl.
               super__Vector_impl_data._M_start)->data,(handle)0x0);
  if (local_40.super__Vector_base<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<MILBlob::UInt3,_std::allocator<MILBlob::UInt3>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (array)(array)this;
}

Assistant:

py::array_t<uint8_t> MilStoragePythonReader::read_uint3_data(uint64_t offset) {
    return readUnsignedSubByteData<MILBlob::UInt3>(*m_reader, offset);
}